

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::WeightParams::SerializeWithCachedSizes
          (WeightParams *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  RepeatedField<float> *this_00;
  float *a;
  long lVar3;
  string *psVar4;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  WeightParams *this_local;
  
  iVar2 = floatvalue_size(this);
  if (0 < iVar2) {
    google::protobuf::internal::WireFormatLite::WriteTag(1,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_floatvalue_cached_byte_size_);
    this_00 = floatvalue(this);
    a = google::protobuf::RepeatedField<float>::data(this_00);
    iVar2 = floatvalue_size(this);
    google::protobuf::internal::WireFormatLite::WriteFloatArray(a,iVar2,output);
  }
  float16value_abi_cxx11_(this);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar4 = float16value_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(2,psVar4,output);
  }
  rawvalue_abi_cxx11_(this);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar4 = rawvalue_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(0x1e,psVar4,output);
  }
  int8rawvalue_abi_cxx11_(this);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar4 = int8rawvalue_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(0x1f,psVar4,output);
  }
  bVar1 = has_quantization(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x28,&this->quantization_->super_MessageLite,output);
  }
  bVar1 = isupdatable(this);
  if (bVar1) {
    bVar1 = isupdatable(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x32,bVar1,output);
  }
  return;
}

Assistant:

void WeightParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.WeightParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated float floatValue = 1;
  if (this->floatvalue_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_floatvalue_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteFloatArray(
      this->floatvalue().data(), this->floatvalue_size(), output);
  }

  // bytes float16Value = 2;
  if (this->float16value().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      2, this->float16value(), output);
  }

  // bytes rawValue = 30;
  if (this->rawvalue().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      30, this->rawvalue(), output);
  }

  // bytes int8RawValue = 31;
  if (this->int8rawvalue().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      31, this->int8rawvalue(), output);
  }

  // .CoreML.Specification.QuantizationParams quantization = 40;
  if (this->has_quantization()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      40, *this->quantization_, output);
  }

  // bool isUpdatable = 50;
  if (this->isupdatable() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(50, this->isupdatable(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.WeightParams)
}